

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O0

void __thiscall AAmbientSound::Deactivate(AAmbientSound *this,AActor *activator)

{
  FAmbientSound *pFVar1;
  FAmbientSound *ambient;
  AActor *activator_local;
  AAmbientSound *this_local;
  
  AActor::Deactivate(&this->super_AActor,activator);
  if (((this->super_AActor).field_0x4bc & 1) != 0) {
    (this->super_AActor).field_0x4bc = 0;
    pFVar1 = TMap<int,_FAmbientSound,_THashTraits<int>,_TValueTraits<FAmbientSound>_>::CheckKey
                       (&Ambients,(this->super_AActor).args[0]);
    if ((pFVar1 != (FAmbientSound *)0x0) && ((pFVar1->type & 3) == 3)) {
      S_StopSound(&this->super_AActor,4);
    }
  }
  return;
}

Assistant:

void AAmbientSound::Deactivate (AActor *activator)
{
	Super::Deactivate (activator);
	if (bActive)
	{
		bActive = false;
		FAmbientSound *ambient = Ambients.CheckKey(args[0]);
		if (ambient != NULL && (ambient->type & CONTINUOUS) == CONTINUOUS)
		{
			S_StopSound (this, CHAN_BODY);
		}
	}
}